

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_standard_tests.cpp
# Opt level: O1

void __thiscall
script_standard_tests::script_standard_Solver_success::test_method
          (script_standard_Solver_success *this)

{
  pointer puVar1;
  pointer puVar2;
  uint uVar3;
  pointer pvVar4;
  TxoutType TVar5;
  int iVar6;
  long lVar7;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar8;
  CScript *pCVar9;
  CSHA256 *this_00;
  uint uVar10;
  size_t sVar11;
  CKey *this_01;
  size_type sVar12;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar13;
  undefined8 uVar14;
  iterator in_R8;
  iterator pvVar15;
  iterator in_R9;
  iterator pvVar16;
  long in_FS_OFFSET;
  readonly_property<bool> rVar17;
  bool bVar18;
  span<const_std::byte,_18446744073709551615UL> b;
  const_string file;
  const_string file_00;
  const_string file_01;
  span<const_std::byte,_18446744073709551615UL> b_00;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  span<const_std::byte,_18446744073709551615UL> b_01;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  span<const_std::byte,_18446744073709551615UL> b_02;
  span<const_std::byte,_18446744073709551615UL> b_03;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  initializer_list<unsigned_char> __l;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  initializer_list<unsigned_char> __l_00;
  span<const_std::byte,_18446744073709551615UL> b_04;
  span<const_std::byte,_18446744073709551615UL> b_05;
  span<const_std::byte,_18446744073709551615UL> b_06;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  initializer_list<unsigned_char> __l_01;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  span<const_std::byte,_18446744073709551615UL> b_07;
  initializer_list<unsigned_char> __l_04;
  span<const_std::byte,_18446744073709551615UL> b_08;
  initializer_list<unsigned_char> __l_05;
  span<const_std::byte,_18446744073709551615UL> b_09;
  const_string file_21;
  const_string file_22;
  span<const_std::byte,_18446744073709551615UL> b_10;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  span<const_std::byte,_18446744073709551615UL> b_11;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  span<const_std::byte,_18446744073709551615UL> b_12;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  span<const_std::byte,_18446744073709551615UL> b_13;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  initializer_list<unsigned_char> __l_06;
  const_string file_35;
  initializer_list<unsigned_char> __l_07;
  span<const_std::byte,_18446744073709551615UL> b_14;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  check_type cVar19;
  undefined4 local_980;
  TxoutType local_97c;
  undefined1 *local_978;
  undefined1 *local_970;
  char *local_968;
  char *local_960;
  char *local_958;
  char *local_950;
  undefined1 *local_948;
  undefined1 *local_940;
  char *local_938;
  char *local_930;
  char *local_928;
  char *local_920;
  undefined1 *local_918;
  undefined1 *local_910;
  char *local_908;
  char *local_900;
  char *local_8f8;
  char *local_8f0;
  undefined1 *local_8e8;
  undefined1 *local_8e0;
  char *local_8d8;
  char *local_8d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witness_program;
  char *local_8b0;
  char *local_8a8;
  undefined1 *local_8a0;
  undefined1 *local_898;
  char *local_890;
  char *local_888;
  int version;
  undefined1 *local_878;
  undefined1 *local_870;
  char *local_868;
  char *local_860;
  char *local_858;
  char *local_850;
  undefined1 *local_848;
  undefined1 *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  char *local_820;
  undefined1 *local_818;
  undefined1 *local_810;
  char *local_808;
  char *local_800;
  undefined1 *local_7f8;
  undefined1 *local_7f0;
  char *local_7e8;
  char *local_7e0;
  undefined1 *local_7d8;
  undefined1 *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  undefined1 *local_7a8;
  undefined1 *local_7a0;
  char *local_798;
  char *local_790;
  undefined1 *local_788;
  undefined1 *local_780;
  char *local_778;
  char *local_770;
  undefined1 *local_768;
  undefined1 *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  undefined1 *local_738;
  undefined1 *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  char *local_6b8;
  char *local_6b0;
  undefined1 *local_6a8;
  undefined1 *local_6a0;
  char *local_698;
  char *local_690;
  undefined1 *local_688;
  undefined1 *local_680;
  char *local_678;
  char *local_670;
  undefined1 *local_668;
  undefined1 *local_660;
  char *local_658;
  char *local_650;
  undefined1 *local_648;
  undefined1 *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  char *local_620;
  undefined1 *local_618;
  undefined1 *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  solutions;
  undefined4 *local_290;
  undefined8 local_288;
  vector<unsigned_char,_std::allocator<unsigned_char>_> anchor_bytes;
  undefined4 **local_268;
  char *local_260;
  assertion_result local_258;
  assertion_result local_240;
  char *local_228;
  undefined1 local_220 [8];
  bool local_218;
  undefined7 uStack_217;
  pointer local_210;
  assertion_result *local_208;
  uint256 scriptHash;
  CScript redeemScript;
  CScript s;
  CPubKey pubkeys [3];
  undefined1 auStack_90 [8];
  CKey keys [3];
  assertion_result local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = 8;
  do {
    auStack_90[lVar7] = 0;
    *(undefined8 *)(&keys[0].fCompressed + lVar7) = 0;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x38);
  pubkeys[0].vch[0] = 0xff;
  pubkeys[1].vch[0] = 0xff;
  pubkeys[2].vch[0] = 0xff;
  this_01 = keys;
  lVar7 = 0;
  do {
    CKey::MakeNewKey(this_01,true);
    CKey::GetPubKey((CPubKey *)local_220,this_01);
    memcpy(pubkeys[0].vch + lVar7,(CPubKey *)local_220,0x41);
    lVar7 = lVar7 + 0x41;
    this_01 = this_01 + 1;
  } while (lVar7 != 0xc3);
  s.super_CScriptBase._union._16_8_ = 0;
  s.super_CScriptBase._24_8_ = 0;
  s.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  s.super_CScriptBase._union._8_8_ = 0;
  solutions.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  solutions.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  solutions.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&s.super_CScriptBase,0);
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    sVar12 = s.super_CScriptBase._size;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity(&s.super_CScriptBase,sVar12);
  ToByteVector<CPubKey>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,pubkeys);
  b._M_extent._M_extent_value = CONCAT71(uStack_217,local_218) - (long)local_220;
  b._M_ptr = (pointer)local_220;
  ppVar8 = &CScript::operator<<(&s,b)->super_CScriptBase;
  uVar10 = ppVar8->_size;
  uVar3 = uVar10 - 0x1d;
  if (uVar10 < 0x1d) {
    uVar3 = uVar10;
  }
  ppVar13 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar8->_union).indirect_contents.indirect;
  if (uVar10 < 0x1d) {
    ppVar13 = ppVar8;
  }
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar8,(uchar *)((long)&ppVar13->_union + (long)(int)uVar3),(uchar *)&local_58);
  if (local_220 != (undefined1  [8])0x0) {
    operator_delete((void *)local_220,(long)local_210 - (long)local_220);
  }
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x2c;
  file.m_begin = (iterator)&local_2b8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2c8,msg);
  redeemScript.super_CScriptBase._union.direct[8] = '\0';
  redeemScript.super_CScriptBase._union.indirect_contents.indirect = "@;\x1f";
  redeemScript.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  redeemScript.super_CScriptBase._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  TVar5 = Solver(&s,&solutions);
  local_258._0_8_ = &witness_program;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(witness_program.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,TVar5);
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_268;
  local_268._0_4_ = 2;
  scriptHash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_240._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_240.m_message.px = (element_type *)0xec6b2d;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013ae1a0;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_40 = &anchor_bytes;
  local_58.m_message.px = (element_type *)((ulong)local_58.m_message.px & 0xffffffffffffff00);
  local_58._0_8_ = &PTR__lazy_ostream_013ae1a0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  local_208 = &local_258;
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = TVar5 == PUBKEY;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptHash,(lazy_ostream *)&redeemScript,1,2,REQUIRE,0xec6b7f,
             (size_t)&local_240,0x2c,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,"TxoutType::PUBKEY",
             &local_58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(scriptHash.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x2d;
  file_00.m_begin = (iterator)&local_2d8;
  msg_00.m_end = pvVar16;
  msg_00.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2e8,
             msg_00);
  redeemScript.super_CScriptBase._union.direct[8] = '\0';
  redeemScript.super_CScriptBase._union.indirect_contents.indirect = "@;\x1f";
  redeemScript.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  redeemScript.super_CScriptBase._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(((long)solutions.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)solutions.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_268 = (undefined4 **)CONCAT44(local_268._4_4_,1);
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] =
       (long)solutions.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)solutions.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start == 0x18;
  scriptHash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_240._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_240.m_message.px = (element_type *)0xec6b2d;
  local_258._0_8_ = &witness_program;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abb70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_268;
  local_58.m_message.px = (element_type *)((ulong)local_58.m_message.px & 0xffffffffffffff00);
  local_58._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &anchor_bytes;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  local_208 = &local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptHash,(lazy_ostream *)&redeemScript,1,2,REQUIRE,0xec6ba6,
             (size_t)&local_240,0x2d,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,"1U",&local_58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(scriptHash.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x2e;
  file_01.m_begin = (iterator)&local_2f8;
  msg_01.m_end = pvVar16;
  msg_01.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_308,
             msg_01);
  pvVar4 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _cVar19 = 0x5b81e1;
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&redeemScript,pubkeys);
  puVar1 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  sVar11 = (long)puVar2 - (long)puVar1;
  if (sVar11 == CONCAT71(redeemScript.super_CScriptBase._union._9_7_,
                         redeemScript.super_CScriptBase._union.direct[8]) -
                redeemScript.super_CScriptBase._union._0_8_) {
    if (puVar2 == puVar1) {
      rVar17.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      _cVar19 = 0x5b8210;
      iVar6 = bcmp(puVar1,redeemScript.super_CScriptBase._union.indirect_contents.indirect,sVar11);
      rVar17.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
    }
  }
  else {
    rVar17.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar17.super_class_property<bool>.value;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_1512399;
  scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"solutions[0] == ToByteVector(pubkeys[0])" + 0x28;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_310 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_208 = (assertion_result *)&scriptHash;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_220,1,0,WARN,_cVar19,(size_t)&local_318,0x2e);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_58 + 0x10));
  if (redeemScript.super_CScriptBase._union.indirect_contents.indirect != (char *)0x0) {
    operator_delete(redeemScript.super_CScriptBase._union.indirect_contents.indirect,
                    redeemScript.super_CScriptBase._union._16_8_ -
                    redeemScript.super_CScriptBase._union._0_8_);
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&s.super_CScriptBase,0);
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    sVar12 = s.super_CScriptBase._size;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity(&s.super_CScriptBase,sVar12);
  uVar14 = s.super_CScriptBase._union.indirect_contents.indirect;
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    uVar14 = &s.super_CScriptBase;
    sVar12 = s.super_CScriptBase._size;
  }
  local_220[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x76;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&s.super_CScriptBase,
             (uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar14)->_union +
                      (long)(int)sVar12),local_220);
  uVar14 = s.super_CScriptBase._union.indirect_contents.indirect;
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    uVar14 = &s.super_CScriptBase;
    sVar12 = s.super_CScriptBase._size;
  }
  local_220[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0xa9;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&s.super_CScriptBase,
             (uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar14)->_union +
                      (long)(int)sVar12),local_220);
  CPubKey::GetID((CKeyID *)&local_58,pubkeys);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_220,(uchar *)&local_58,
             (uchar *)((long)&local_58 + 0x14),(allocator_type *)&redeemScript);
  b_00._M_extent._M_extent_value = CONCAT71(uStack_217,local_218) - (long)local_220;
  b_00._M_ptr = (pointer)local_220;
  ppVar8 = &CScript::operator<<(&s,b_00)->super_CScriptBase;
  uVar10 = ppVar8->_size;
  uVar3 = uVar10 - 0x1d;
  if (uVar10 < 0x1d) {
    uVar3 = uVar10;
  }
  ppVar13 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar8->_union).indirect_contents.indirect;
  if (uVar10 < 0x1d) {
    ppVar13 = ppVar8;
  }
  redeemScript.super_CScriptBase._union.direct[0] = 0x88;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar8,(uchar *)((long)&ppVar13->_union + (long)(int)uVar3),(uchar *)&redeemScript);
  uVar10 = ppVar8->_size;
  uVar3 = uVar10 - 0x1d;
  if (uVar10 < 0x1d) {
    uVar3 = uVar10;
  }
  ppVar13 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar8->_union).indirect_contents.indirect;
  if (uVar10 < 0x1d) {
    ppVar13 = ppVar8;
  }
  redeemScript.super_CScriptBase._union.direct[0] = 0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar8,(uchar *)((long)&ppVar13->_union + (long)(int)uVar3),(uchar *)&redeemScript);
  if (local_220 != (undefined1  [8])0x0) {
    operator_delete((void *)local_220,(long)local_210 - (long)local_220);
  }
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x33;
  file_02.m_begin = (iterator)&local_328;
  msg_02.m_end = pvVar16;
  msg_02.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_338,
             msg_02);
  redeemScript.super_CScriptBase._union.direct[8] = '\0';
  redeemScript.super_CScriptBase._union.indirect_contents.indirect = "@;\x1f";
  redeemScript.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  redeemScript.super_CScriptBase._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  TVar5 = Solver(&s,&solutions);
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(witness_program.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,TVar5);
  local_268._0_4_ = 3;
  scriptHash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_240._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_240.m_message.px = (element_type *)0xec6b2d;
  local_258._0_8_ = &witness_program;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013ae1a0;
  local_210 = boost::unit_test::lazy_ostream::inst;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_268;
  local_58.m_message.px = (element_type *)((ulong)local_58.m_message.px & 0xffffffffffffff00);
  local_58._0_8_ = &PTR__lazy_ostream_013ae1a0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &anchor_bytes;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  local_208 = &local_258;
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = TVar5 == PUBKEYHASH;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptHash,(lazy_ostream *)&redeemScript,1,2,REQUIRE,0xec6b7f,
             (size_t)&local_240,0x33,
             (vector<unsigned_char,std::allocator<unsigned_char>> *)local_220,
             "TxoutType::PUBKEYHASH",&local_58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(scriptHash.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x34;
  file_03.m_begin = (iterator)&local_348;
  msg_03.m_end = pvVar16;
  msg_03.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_358,
             msg_03);
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(((long)solutions.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)solutions.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  redeemScript.super_CScriptBase._union.direct[8] = '\0';
  redeemScript.super_CScriptBase._union.indirect_contents.indirect = "@;\x1f";
  redeemScript.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  redeemScript.super_CScriptBase._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abb70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] =
       (long)solutions.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)solutions.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start == 0x18;
  local_268 = (undefined4 **)CONCAT44(local_268._4_4_,1);
  scriptHash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_58.m_message.px = (element_type *)((ulong)local_58.m_message.px & 0xffffffffffffff00);
  local_240._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_240.m_message.px = (element_type *)0xec6b2d;
  local_258._0_8_ = &witness_program;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_268;
  local_58._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &anchor_bytes;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  local_208 = &local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptHash,(lazy_ostream *)&redeemScript,1,2,REQUIRE,0xec6ba6,
             (size_t)&local_240,0x34,
             (vector<unsigned_char,std::allocator<unsigned_char>> *)local_220,"1U",&local_58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(scriptHash.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x35;
  file_04.m_begin = (iterator)&local_368;
  msg_04.m_end = pvVar16;
  msg_04.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_378,
             msg_04);
  pvVar4 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  CPubKey::GetID((CKeyID *)&scriptHash,pubkeys);
  _cVar19 = 0x5b879d;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&redeemScript,
             (uchar *)&scriptHash,scriptHash.super_base_blob<256U>.m_data._M_elems + 0x14,
             (allocator_type *)local_220);
  puVar1 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  sVar11 = (long)puVar2 - (long)puVar1;
  if (sVar11 == CONCAT71(redeemScript.super_CScriptBase._union._9_7_,
                         redeemScript.super_CScriptBase._union.direct[8]) -
                redeemScript.super_CScriptBase._union._0_8_) {
    if (puVar2 == puVar1) {
      rVar17.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      _cVar19 = 0x5b87d3;
      iVar6 = bcmp(puVar1,redeemScript.super_CScriptBase._union.indirect_contents.indirect,sVar11);
      rVar17.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
    }
  }
  else {
    rVar17.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar17.super_class_property<bool>.value;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_240._0_8_ = "solutions[0] == ToByteVector(pubkeys[0].GetID())";
  local_240.m_message.px = (element_type *)0xec6c26;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_380 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_208 = &local_240;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_220,1,0,WARN,_cVar19,(size_t)&local_388,0x35);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_58 + 0x10));
  if (redeemScript.super_CScriptBase._union.indirect_contents.indirect != (char *)0x0) {
    operator_delete(redeemScript.super_CScriptBase._union.indirect_contents.indirect,
                    redeemScript.super_CScriptBase._union._16_8_ -
                    redeemScript.super_CScriptBase._union._0_8_);
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&redeemScript.super_CScriptBase,&s.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&s.super_CScriptBase,0);
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    sVar12 = s.super_CScriptBase._size;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity(&s.super_CScriptBase,sVar12);
  uVar14 = s.super_CScriptBase._union.indirect_contents.indirect;
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    uVar14 = &s.super_CScriptBase;
    sVar12 = s.super_CScriptBase._size;
  }
  local_220[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0xa9;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&s.super_CScriptBase,
             (uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar14)->_union +
                      (long)(int)sVar12),local_220);
  CScriptID::CScriptID((CScriptID *)&local_58,&redeemScript);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_220,(uchar *)&local_58,
             (uchar *)((long)&local_58 + 0x14),(allocator_type *)&scriptHash);
  b_01._M_extent._M_extent_value = CONCAT71(uStack_217,local_218) - (long)local_220;
  b_01._M_ptr = (pointer)local_220;
  ppVar8 = &CScript::operator<<(&s,b_01)->super_CScriptBase;
  uVar10 = ppVar8->_size;
  uVar3 = uVar10 - 0x1d;
  if (uVar10 < 0x1d) {
    uVar3 = uVar10;
  }
  ppVar13 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar8->_union).indirect_contents.indirect;
  if (uVar10 < 0x1d) {
    ppVar13 = ppVar8;
  }
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = 0x87;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar8,(uchar *)((long)&ppVar13->_union + (long)(int)uVar3),(uchar *)&scriptHash);
  if (local_220 != (undefined1  [8])0x0) {
    operator_delete((void *)local_220,(long)local_210 - (long)local_220);
  }
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x3b;
  file_05.m_begin = (iterator)&local_398;
  msg_05.m_end = pvVar16;
  msg_05.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_3a8,
             msg_05);
  scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013abb30;
  scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptHash.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  TVar5 = Solver(&s,&solutions);
  local_268 = (undefined4 **)CONCAT44(local_268._4_4_,TVar5);
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_288;
  local_288._0_4_ = 4;
  local_240.m_message.px = (element_type *)0x0;
  local_240.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_258.m_message.px = (element_type *)0xec6b2d;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_268;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013ae1a0;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (assertion_result *)&anchor_bytes;
  local_58.m_message.px = (element_type *)((ulong)local_58.m_message.px & 0xffffffffffffff00);
  local_58._0_8_ = &PTR__lazy_ostream_013ae1a0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &witness_program;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  local_240.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(TVar5 == SCRIPTHASH);
  boost::test_tools::tt_detail::report_assertion
            (&local_240,(lazy_ostream *)&scriptHash,1,2,REQUIRE,0xec6b7f,(size_t)&local_258,0x3b,
             (vector<unsigned_char,std::allocator<unsigned_char>> *)local_220,
             "TxoutType::SCRIPTHASH",&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_240 + 0x10));
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x3c;
  file_06.m_begin = (iterator)&local_3b8;
  msg_06.m_end = pvVar16;
  msg_06.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3c8,
             msg_06);
  local_268 = (undefined4 **)
              (((long)solutions.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)solutions.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013abb30;
  scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptHash.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_240.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((long)solutions.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)solutions.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x18);
  local_288 = (TxoutType *)CONCAT44(local_288._4_4_,1);
  local_240.m_message.px = (element_type *)0x0;
  local_240.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_218 = false;
  local_58.m_message.px = (element_type *)((ulong)local_58.m_message.px & 0xffffffffffffff00);
  local_258._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_258.m_message.px = (element_type *)0xec6b2d;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_268;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abb70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (assertion_result *)&anchor_bytes;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_288;
  local_58._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &witness_program;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_240,(lazy_ostream *)&scriptHash,1,2,REQUIRE,0xec6ba6,(size_t)&local_258,0x3c,
             (vector<unsigned_char,std::allocator<unsigned_char>> *)local_220,"1U",&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_240 + 0x10));
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x3d;
  file_07.m_begin = (iterator)&local_3d8;
  msg_07.m_end = pvVar16;
  msg_07.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3e8,
             msg_07);
  pvVar4 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  CScriptID::CScriptID((CScriptID *)&local_240,&redeemScript);
  _cVar19 = 0x5b8d3a;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&scriptHash,(uchar *)&local_240,
             (uchar *)((long)&local_240 + 0x14),(allocator_type *)local_220);
  puVar1 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  sVar11 = (long)puVar2 - (long)puVar1;
  if (sVar11 == scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ -
                scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_) {
    if (puVar2 == puVar1) {
      bVar18 = true;
    }
    else {
      _cVar19 = 0x5b8d7e;
      iVar6 = bcmp(puVar1,(void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,sVar11);
      bVar18 = iVar6 == 0;
    }
  }
  else {
    bVar18 = false;
  }
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar18;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258._0_8_ = "solutions[0] == ToByteVector(CScriptID(redeemScript))";
  local_258.m_message.px = (element_type *)0xec6c72;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3f0 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_208 = &local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_220,1,0,WARN,_cVar19,(size_t)&local_3f8,0x3d);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_58 + 0x10));
  if (scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ != 0) {
    operator_delete((void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ -
                    scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_);
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&s.super_CScriptBase,0);
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    sVar12 = s.super_CScriptBase._size;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity(&s.super_CScriptBase,sVar12);
  uVar14 = s.super_CScriptBase._union.indirect_contents.indirect;
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    uVar14 = &s.super_CScriptBase;
    sVar12 = s.super_CScriptBase._size;
  }
  local_220[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&s.super_CScriptBase,
             (uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar14)->_union +
                      (long)(int)sVar12),local_220);
  ToByteVector<CPubKey>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,pubkeys);
  b_02._M_extent._M_extent_value = CONCAT71(uStack_217,local_218) - (long)local_220;
  b_02._M_ptr = (pointer)local_220;
  pCVar9 = CScript::operator<<(&s,b_02);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,pubkeys + 1);
  b_03._M_extent._M_extent_value = (long)local_58.m_message.px - local_58._0_8_;
  b_03._M_ptr = (pointer)local_58._0_8_;
  ppVar8 = &CScript::operator<<(pCVar9,b_03)->super_CScriptBase;
  uVar10 = ppVar8->_size;
  uVar3 = uVar10 - 0x1d;
  if (uVar10 < 0x1d) {
    uVar3 = uVar10;
  }
  ppVar13 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar8->_union).indirect_contents.indirect;
  if (uVar10 < 0x1d) {
    ppVar13 = ppVar8;
  }
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = 'R';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar8,(uchar *)((long)&ppVar13->_union + (long)(int)uVar3),(uchar *)&scriptHash);
  uVar10 = ppVar8->_size;
  uVar3 = uVar10 - 0x1d;
  if (uVar10 < 0x1d) {
    uVar3 = uVar10;
  }
  ppVar13 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar8->_union).indirect_contents.indirect;
  if (uVar10 < 0x1d) {
    ppVar13 = ppVar8;
  }
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = 0xae;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar8,(uchar *)((long)&ppVar13->_union + (long)(int)uVar3),(uchar *)&scriptHash);
  if ((pointer)local_58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_58._0_8_,(long)local_58.m_message.pn.pi_ - local_58._0_8_);
  }
  if (local_220 != (undefined1  [8])0x0) {
    operator_delete((void *)local_220,(long)local_210 - (long)local_220);
  }
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x45;
  file_08.m_begin = (iterator)&local_408;
  msg_08.m_end = pvVar16;
  msg_08.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_418,
             msg_08);
  scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013abb30;
  scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptHash.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  TVar5 = Solver(&s,&solutions);
  local_268 = (undefined4 **)CONCAT44(local_268._4_4_,TVar5);
  local_288._0_4_ = 5;
  local_240.m_message.px = (element_type *)0x0;
  local_240.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_258.m_message.px = (element_type *)0xec6b2d;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_268;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013ae1a0;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (assertion_result *)&anchor_bytes;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_288;
  local_58.m_message.px = (element_type *)((ulong)local_58.m_message.px & 0xffffffffffffff00);
  local_58._0_8_ = &PTR__lazy_ostream_013ae1a0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &witness_program;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  local_240.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(TVar5 == MULTISIG);
  boost::test_tools::tt_detail::report_assertion
            (&local_240,(lazy_ostream *)&scriptHash,1,2,REQUIRE,0xec6b7f,(size_t)&local_258,0x45,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,
             "TxoutType::MULTISIG",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_240 + 0x10));
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x46;
  file_09.m_begin = (iterator)&local_428;
  msg_09.m_end = pvVar16;
  msg_09.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_438,
             msg_09);
  local_268 = (undefined4 **)
              (((long)solutions.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)solutions.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013abb30;
  scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptHash.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abb70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (assertion_result *)&anchor_bytes;
  local_240.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((long)solutions.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)solutions.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x60);
  local_288 = (TxoutType *)CONCAT44(local_288._4_4_,4);
  local_240.m_message.px = (element_type *)0x0;
  local_240.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_58.m_message.px = (element_type *)((ulong)local_58.m_message.px & 0xffffffffffffff00);
  local_258._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_258.m_message.px = (element_type *)0xec6b2d;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_268;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_288;
  local_58._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &witness_program;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_240,(lazy_ostream *)&scriptHash,1,2,REQUIRE,0xec6ba6,(size_t)&local_258,0x46,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,"4U",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_240 + 0x10));
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x47;
  file_10.m_begin = (iterator)&local_448;
  msg_10.m_end = pvVar16;
  msg_10.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_458,
             msg_10);
  pvVar4 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  _cVar19 = 0x5b931c;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_258;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash,__l,
             (allocator_type *)&anchor_bytes);
  puVar1 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  sVar11 = (long)puVar2 - (long)puVar1;
  if (sVar11 == scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ -
                scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_) {
    if (puVar2 == puVar1) {
      rVar17.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      _cVar19 = 0x5b9360;
      iVar6 = bcmp(puVar1,(void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,sVar11);
      rVar17.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
    }
  }
  else {
    rVar17.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar17.super_class_property<bool>.value;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_240._0_8_ = "solutions[0] == std::vector<unsigned char>({1})";
  local_240.m_message.px = (element_type *)0xec6ca2;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_460 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_208 = &local_240;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_220,1,0,WARN,_cVar19,(size_t)&local_468,0x47);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_58 + 0x10));
  if (scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ != 0) {
    operator_delete((void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ -
                    scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_);
  }
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x48;
  file_11.m_begin = (iterator)&local_478;
  msg_11.m_end = pvVar16;
  msg_11.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_488,
             msg_11);
  pvVar4 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _cVar19 = 0x5b9465;
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash,pubkeys);
  puVar1 = pvVar4[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = pvVar4[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar11 = (long)puVar2 - (long)puVar1;
  if (sVar11 == scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ -
                scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_) {
    if (puVar2 == puVar1) {
      rVar17.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      _cVar19 = 0x5b94aa;
      iVar6 = bcmp(puVar1,(void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,sVar11);
      rVar17.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
    }
  }
  else {
    rVar17.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar17.super_class_property<bool>.value;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_240._0_8_ = "solutions[1] == ToByteVector(pubkeys[0])";
  local_240.m_message.px = (element_type *)0xec6ccb;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_490 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_208 = &local_240;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_220,1,0,WARN,_cVar19,(size_t)&local_498,0x48);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_58 + 0x10));
  if (scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ != 0) {
    operator_delete((void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ -
                    scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_);
  }
  local_4a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x49;
  file_12.m_begin = (iterator)&local_4a8;
  msg_12.m_end = pvVar16;
  msg_12.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_4b8,
             msg_12);
  pvVar4 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _cVar19 = 0x5b95af;
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash,pubkeys + 1);
  puVar1 = pvVar4[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = pvVar4[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar11 = (long)puVar2 - (long)puVar1;
  if (sVar11 == scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ -
                scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_) {
    if (puVar2 == puVar1) {
      rVar17.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      _cVar19 = 0x5b95f4;
      iVar6 = bcmp(puVar1,(void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,sVar11);
      rVar17.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
    }
  }
  else {
    rVar17.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar17.super_class_property<bool>.value;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_240._0_8_ = "solutions[2] == ToByteVector(pubkeys[1])";
  local_240.m_message.px = (element_type *)0xec6cf4;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_4c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_4c0 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_208 = &local_240;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_220,1,0,WARN,_cVar19,(size_t)&local_4c8,0x49);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_58 + 0x10));
  if (scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ != 0) {
    operator_delete((void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ -
                    scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_);
  }
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x4a;
  file_13.m_begin = (iterator)&local_4d8;
  msg_13.m_end = pvVar16;
  msg_13.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_4e8,
             msg_13);
  pvVar4 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x2;
  _cVar19 = 0x5b970c;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_258;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash,__l_00,
             (allocator_type *)&anchor_bytes);
  puVar1 = pvVar4[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = pvVar4[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar11 = (long)puVar2 - (long)puVar1;
  if (sVar11 == scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ -
                scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_) {
    if (puVar2 == puVar1) {
      bVar18 = true;
    }
    else {
      _cVar19 = 0x5b974a;
      iVar6 = bcmp(puVar1,(void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,sVar11);
      bVar18 = iVar6 == 0;
    }
  }
  else {
    bVar18 = false;
  }
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar18;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_240._0_8_ = "solutions[3] == std::vector<unsigned char>({2})";
  local_240.m_message.px = (element_type *)0xec6d24;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_4f0 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_208 = &local_240;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_220,1,0,WARN,_cVar19,(size_t)&local_4f8,0x4a);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_58 + 0x10));
  if (scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ != 0) {
    operator_delete((void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ -
                    scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_);
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&s.super_CScriptBase,0);
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    sVar12 = s.super_CScriptBase._size;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity(&s.super_CScriptBase,sVar12);
  uVar14 = s.super_CScriptBase._union.indirect_contents.indirect;
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    uVar14 = &s.super_CScriptBase;
    sVar12 = s.super_CScriptBase._size;
  }
  local_220[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x52;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&s.super_CScriptBase,
             (uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar14)->_union +
                      (long)(int)sVar12),local_220);
  ToByteVector<CPubKey>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,pubkeys);
  b_04._M_extent._M_extent_value = CONCAT71(uStack_217,local_218) - (long)local_220;
  b_04._M_ptr = (pointer)local_220;
  pCVar9 = CScript::operator<<(&s,b_04);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,pubkeys + 1);
  b_05._M_extent._M_extent_value = (long)local_58.m_message.px - local_58._0_8_;
  b_05._M_ptr = (pointer)local_58._0_8_;
  pCVar9 = CScript::operator<<(pCVar9,b_05);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash,pubkeys + 2);
  b_06._M_extent._M_extent_value =
       scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ -
       scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_;
  b_06._M_ptr = (pointer)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_;
  ppVar8 = &CScript::operator<<(pCVar9,b_06)->super_CScriptBase;
  uVar10 = ppVar8->_size;
  uVar3 = uVar10 - 0x1d;
  if (uVar10 < 0x1d) {
    uVar3 = uVar10;
  }
  ppVar13 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar8->_union).indirect_contents.indirect;
  if (uVar10 < 0x1d) {
    ppVar13 = ppVar8;
  }
  local_240.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x53;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar8,(uchar *)((long)&ppVar13->_union + (long)(int)uVar3),(uchar *)&local_240);
  uVar10 = ppVar8->_size;
  uVar3 = uVar10 - 0x1d;
  if (uVar10 < 0x1d) {
    uVar3 = uVar10;
  }
  ppVar13 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar8->_union).indirect_contents.indirect;
  if (uVar10 < 0x1d) {
    ppVar13 = ppVar8;
  }
  local_240.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0xae;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar8,(uchar *)((long)&ppVar13->_union + (long)(int)uVar3),(uchar *)&local_240);
  if (scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ != 0) {
    operator_delete((void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ -
                    scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_);
  }
  if ((pointer)local_58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_58._0_8_,(long)local_58.m_message.pn.pi_ - local_58._0_8_);
  }
  if (local_220 != (undefined1  [8])0x0) {
    operator_delete((void *)local_220,(long)local_210 - (long)local_220);
  }
  local_508 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x52;
  file_14.m_begin = (iterator)&local_508;
  msg_14.m_end = pvVar16;
  msg_14.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_518,
             msg_14);
  scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013abb30;
  scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptHash.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  TVar5 = Solver(&s,&solutions);
  local_268 = (undefined4 **)CONCAT44(local_268._4_4_,TVar5);
  local_288._0_4_ = 5;
  local_240.m_message.px = (element_type *)0x0;
  local_240.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_258.m_message.px = (element_type *)0xec6b2d;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_268;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013ae1a0;
  local_210 = boost::unit_test::lazy_ostream::inst;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_288;
  local_58.m_message.px = (element_type *)((ulong)local_58.m_message.px & 0xffffffffffffff00);
  local_58._0_8_ = &PTR__lazy_ostream_013ae1a0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &witness_program;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  local_208 = (assertion_result *)&anchor_bytes;
  local_240.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(TVar5 == MULTISIG);
  boost::test_tools::tt_detail::report_assertion
            (&local_240,(lazy_ostream *)&scriptHash,1,2,REQUIRE,0xec6b7f,(size_t)&local_258,0x52,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,
             "TxoutType::MULTISIG",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_240 + 0x10));
  local_528 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x53;
  file_15.m_begin = (iterator)&local_528;
  msg_15.m_end = pvVar16;
  msg_15.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_538,
             msg_15);
  local_268 = (undefined4 **)
              (((long)solutions.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)solutions.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_268;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abb70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_288;
  scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013abb30;
  scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptHash.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_288 = (TxoutType *)CONCAT44(local_288._4_4_,5);
  local_58.m_message.px = (element_type *)((ulong)local_58.m_message.px & 0xffffffffffffff00);
  local_240.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((long)solutions.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)solutions.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x78);
  local_240.m_message.px = (element_type *)0x0;
  local_240.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &witness_program;
  local_258._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_258.m_message.px = (element_type *)0xec6b2d;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  local_208 = (assertion_result *)&anchor_bytes;
  boost::test_tools::tt_detail::report_assertion
            (&local_240,(lazy_ostream *)&scriptHash,1,2,REQUIRE,0xec6ba6,(size_t)&local_258,0x53,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,"5U",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_240 + 0x10));
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x54;
  file_16.m_begin = (iterator)&local_548;
  msg_16.m_end = pvVar16;
  msg_16.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_558,
             msg_16);
  pvVar4 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x2;
  _cVar19 = 0x5b9d2f;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_258;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash,__l_01,
             (allocator_type *)&anchor_bytes);
  puVar1 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  sVar11 = (long)puVar2 - (long)puVar1;
  if (sVar11 == scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ -
                scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_) {
    if (puVar2 == puVar1) {
      rVar17.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      _cVar19 = 0x5b9d6c;
      iVar6 = bcmp(puVar1,(void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,sVar11);
      rVar17.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
    }
  }
  else {
    rVar17.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar17.super_class_property<bool>.value;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_240._0_8_ = "solutions[0] == std::vector<unsigned char>({2})";
  local_240.m_message.px = (element_type *)0xec6d54;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_560 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_208 = &local_240;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_220,1,0,WARN,_cVar19,(size_t)&local_568,0x54);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_58 + 0x10));
  if (scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ != 0) {
    operator_delete((void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ -
                    scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_);
  }
  local_578 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_570 = "";
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x55;
  file_17.m_begin = (iterator)&local_578;
  msg_17.m_end = pvVar16;
  msg_17.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_588,
             msg_17);
  pvVar4 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _cVar19 = 0x5b9e7f;
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash,pubkeys);
  puVar1 = pvVar4[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = pvVar4[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar11 = (long)puVar2 - (long)puVar1;
  if (sVar11 == scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ -
                scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_) {
    if (puVar2 == puVar1) {
      rVar17.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      _cVar19 = 0x5b9ecb;
      iVar6 = bcmp(puVar1,(void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,sVar11);
      rVar17.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
    }
  }
  else {
    rVar17.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar17.super_class_property<bool>.value;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_240._0_8_ = "solutions[1] == ToByteVector(pubkeys[0])";
  local_240.m_message.px = (element_type *)0xec6ccb;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_598 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_590 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_208 = &local_240;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_220,1,0,WARN,_cVar19,(size_t)&local_598,0x55);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_58 + 0x10));
  if (scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ != 0) {
    operator_delete((void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ -
                    scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_);
  }
  local_5a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_5a0 = "";
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x56;
  file_18.m_begin = (iterator)&local_5a8;
  msg_18.m_end = pvVar16;
  msg_18.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_5b8,
             msg_18);
  pvVar4 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _cVar19 = 0x5b9fd0;
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash,pubkeys + 1);
  puVar1 = pvVar4[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = pvVar4[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar11 = (long)puVar2 - (long)puVar1;
  if (sVar11 == scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ -
                scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_) {
    if (puVar2 == puVar1) {
      rVar17.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      _cVar19 = 0x5ba01c;
      iVar6 = bcmp(puVar1,(void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,sVar11);
      rVar17.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
    }
  }
  else {
    rVar17.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar17.super_class_property<bool>.value;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_240._0_8_ = "solutions[2] == ToByteVector(pubkeys[1])";
  local_240.m_message.px = (element_type *)0xec6cf4;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_5c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_5c0 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_208 = &local_240;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_220,1,0,WARN,_cVar19,(size_t)&local_5c8,0x56);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_58 + 0x10));
  if (scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ != 0) {
    operator_delete((void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ -
                    scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_);
  }
  local_5d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_5d0 = "";
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x57;
  file_19.m_begin = (iterator)&local_5d8;
  msg_19.m_end = pvVar16;
  msg_19.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_5e8,
             msg_19);
  pvVar4 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _cVar19 = 0x5ba121;
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash,pubkeys + 2);
  puVar1 = pvVar4[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = pvVar4[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar11 = (long)puVar2 - (long)puVar1;
  if (sVar11 == scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ -
                scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_) {
    if (puVar2 == puVar1) {
      rVar17.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      _cVar19 = 0x5ba15f;
      iVar6 = bcmp(puVar1,(void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,sVar11);
      rVar17.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
    }
  }
  else {
    rVar17.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar17.super_class_property<bool>.value;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_240._0_8_ = "solutions[3] == ToByteVector(pubkeys[2])";
  local_240.m_message.px = (element_type *)0xec6d7d;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_5f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_5f0 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_208 = &local_240;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_220,1,0,WARN,_cVar19,(size_t)&local_5f8,0x57);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_58 + 0x10));
  if (scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ != 0) {
    operator_delete((void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ -
                    scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_);
  }
  local_608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_600 = "";
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = &DAT_00000058;
  file_20.m_begin = (iterator)&local_608;
  msg_20.m_end = pvVar16;
  msg_20.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_618,
             msg_20);
  pvVar4 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x3;
  _cVar19 = 0x5ba282;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_258;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash,__l_02,
             (allocator_type *)&anchor_bytes);
  puVar1 = pvVar4[4].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = pvVar4[4].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar11 = (long)puVar2 - (long)puVar1;
  if (sVar11 == scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ -
                scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_) {
    if (puVar2 == puVar1) {
      bVar18 = true;
    }
    else {
      _cVar19 = 0x5ba2c0;
      iVar6 = bcmp(puVar1,(void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,sVar11);
      bVar18 = iVar6 == 0;
    }
  }
  else {
    bVar18 = false;
  }
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar18;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_240._0_8_ = "solutions[4] == std::vector<unsigned char>({3})";
  local_240.m_message.px = (element_type *)0xec6dad;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_628 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_620 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_208 = &local_240;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_220,1,0,WARN,_cVar19,(size_t)&local_628,0x58);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_58 + 0x10));
  if (scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ != 0) {
    operator_delete((void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ -
                    scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_);
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&s.super_CScriptBase,0);
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    sVar12 = s.super_CScriptBase._size;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity(&s.super_CScriptBase,sVar12);
  uVar14 = s.super_CScriptBase._union.indirect_contents.indirect;
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    uVar14 = &s.super_CScriptBase;
    sVar12 = s.super_CScriptBase._size;
  }
  local_220[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x6a;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&s.super_CScriptBase,
             (uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar14)->_union +
                      (long)(int)sVar12),local_220);
  local_240._0_8_ = local_240._0_8_ & 0xffffffffffffff00;
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&local_240;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,__l_03,
             (allocator_type *)&local_258);
  b_07._M_extent._M_extent_value = CONCAT71(uStack_217,local_218) - (long)local_220;
  b_07._M_ptr = (pointer)local_220;
  pCVar9 = CScript::operator<<(&s,b_07);
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(anchor_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,0x4b);
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&anchor_bytes;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,__l_04,
             (allocator_type *)&witness_program);
  b_08._M_extent._M_extent_value = (long)local_58.m_message.px - local_58._0_8_;
  b_08._M_ptr = (pointer)local_58._0_8_;
  pCVar9 = CScript::operator<<(pCVar9,b_08);
  local_268 = (undefined4 **)CONCAT71(local_268._1_7_,0xff);
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)&local_268;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash,__l_05,
             (allocator_type *)&local_288);
  b_09._M_extent._M_extent_value =
       scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ -
       scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_;
  b_09._M_ptr = (pointer)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_;
  CScript::operator<<(pCVar9,b_09);
  if (scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ != 0) {
    operator_delete((void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ -
                    scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_);
  }
  if ((pointer)local_58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_58._0_8_,(long)local_58.m_message.pn.pi_ - local_58._0_8_);
  }
  if (local_220 != (undefined1  [8])0x0) {
    operator_delete((void *)local_220,(long)local_210 - (long)local_220);
  }
  local_638 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_630 = "";
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x60;
  file_21.m_begin = (iterator)&local_638;
  msg_21.m_end = pvVar16;
  msg_21.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_648,
             msg_21);
  scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013abb30;
  scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptHash.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  TVar5 = Solver(&s,&solutions);
  local_268 = (undefined4 **)CONCAT44(local_268._4_4_,TVar5);
  local_288._0_4_ = 6;
  local_240.m_message.px = (element_type *)0x0;
  local_240.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_258.m_message.px = (element_type *)0xec6b2d;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_268;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013ae1a0;
  local_210 = boost::unit_test::lazy_ostream::inst;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_288;
  local_58.m_message.px = (element_type *)((ulong)local_58.m_message.px & 0xffffffffffffff00);
  local_58._0_8_ = &PTR__lazy_ostream_013ae1a0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &witness_program;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  local_208 = (assertion_result *)&anchor_bytes;
  local_240.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(TVar5 == NULL_DATA);
  boost::test_tools::tt_detail::report_assertion
            (&local_240,(lazy_ostream *)&scriptHash,1,2,REQUIRE,0xec6b7f,(size_t)&local_258,0x60,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,
             "TxoutType::NULL_DATA",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_240 + 0x10));
  local_658 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_650 = "";
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x61;
  file_22.m_begin = (iterator)&local_658;
  msg_22.m_end = pvVar16;
  msg_22.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_668,
             msg_22);
  local_268 = (undefined4 **)
              (((long)solutions.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)solutions.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013abb30;
  scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptHash.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_240.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (solutions.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
       solutions.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start);
  local_288 = (TxoutType *)((ulong)local_288._4_4_ << 0x20);
  local_240.m_message.px = (element_type *)0x0;
  local_240.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_218 = false;
  local_58.m_message.px = (element_type *)((ulong)local_58.m_message.px & 0xffffffffffffff00);
  local_258._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_258.m_message.px = (element_type *)0xec6b2d;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_268;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abb70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_288;
  local_58._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &witness_program;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  local_208 = (assertion_result *)&anchor_bytes;
  boost::test_tools::tt_detail::report_assertion
            (&local_240,(lazy_ostream *)&scriptHash,1,2,REQUIRE,0xec6ba6,(size_t)&local_258,0x61,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,"0U",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_240 + 0x10));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&s.super_CScriptBase,0);
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    sVar12 = s.super_CScriptBase._size;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity(&s.super_CScriptBase,sVar12);
  uVar14 = s.super_CScriptBase._union.indirect_contents.indirect;
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    uVar14 = &s.super_CScriptBase;
    sVar12 = s.super_CScriptBase._size;
  }
  local_220 = (undefined1  [8])((ulong)local_220 & 0xffffffffffffff00);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&s.super_CScriptBase,
             (uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar14)->_union +
                      (long)(int)sVar12),local_220);
  CPubKey::GetID((CKeyID *)&local_58,pubkeys);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_220,(uchar *)&local_58,
             (uchar *)((long)&local_58 + 0x14),(allocator_type *)&scriptHash);
  b_10._M_extent._M_extent_value = CONCAT71(uStack_217,local_218) - (long)local_220;
  b_10._M_ptr = (pointer)local_220;
  CScript::operator<<(&s,b_10);
  if (local_220 != (undefined1  [8])0x0) {
    operator_delete((void *)local_220,(long)local_210 - (long)local_220);
  }
  local_678 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_670 = "";
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x66;
  file_23.m_begin = (iterator)&local_678;
  msg_23.m_end = pvVar16;
  msg_23.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_688,
             msg_23);
  scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013abb30;
  scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptHash.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  TVar5 = Solver(&s,&solutions);
  local_268 = (undefined4 **)CONCAT44(local_268._4_4_,TVar5);
  local_288._0_4_ = 8;
  local_240.m_message.px = (element_type *)0x0;
  local_240.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_258.m_message.px = (element_type *)0xec6b2d;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_268;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013ae1a0;
  local_210 = boost::unit_test::lazy_ostream::inst;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_288;
  local_58.m_message.px = (element_type *)((ulong)local_58.m_message.px & 0xffffffffffffff00);
  local_58._0_8_ = &PTR__lazy_ostream_013ae1a0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &witness_program;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  local_208 = (assertion_result *)&anchor_bytes;
  local_240.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(TVar5 == WITNESS_V0_KEYHASH);
  boost::test_tools::tt_detail::report_assertion
            (&local_240,(lazy_ostream *)&scriptHash,1,2,REQUIRE,0xec6b7f,(size_t)&local_258,0x66,
             (vector<unsigned_char,std::allocator<unsigned_char>> *)local_220,
             "TxoutType::WITNESS_V0_KEYHASH",&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_240 + 0x10));
  local_698 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_690 = "";
  local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x67;
  file_24.m_begin = (iterator)&local_698;
  msg_24.m_end = pvVar16;
  msg_24.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_6a8,
             msg_24);
  local_268 = (undefined4 **)
              (((long)solutions.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)solutions.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013abb30;
  scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptHash.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abb70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_240.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((long)solutions.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)solutions.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x18);
  local_288 = (TxoutType *)CONCAT44(local_288._4_4_,1);
  local_240.m_message.px = (element_type *)0x0;
  local_240.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_58.m_message.px = (element_type *)((ulong)local_58.m_message.px & 0xffffffffffffff00);
  local_258._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_258.m_message.px = (element_type *)0xec6b2d;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_268;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_288;
  local_58._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &witness_program;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  local_208 = (assertion_result *)&anchor_bytes;
  boost::test_tools::tt_detail::report_assertion
            (&local_240,(lazy_ostream *)&scriptHash,1,2,REQUIRE,0xec6ba6,(size_t)&local_258,0x67,
             (vector<unsigned_char,std::allocator<unsigned_char>> *)local_220,"1U",&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_240 + 0x10));
  local_6b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_6b0 = "";
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = &DAT_00000068;
  file_25.m_begin = (iterator)&local_6b8;
  msg_25.m_end = pvVar16;
  msg_25.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_6c8,
             msg_25);
  pvVar4 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  CPubKey::GetID((CKeyID *)&local_240,pubkeys);
  _cVar19 = 0x5bac82;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&scriptHash,(uchar *)&local_240,
             (uchar *)((long)&local_240 + 0x14),(allocator_type *)local_220);
  puVar1 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  sVar11 = (long)puVar2 - (long)puVar1;
  if (sVar11 == scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ -
                scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_) {
    if (puVar2 == puVar1) {
      rVar17.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      _cVar19 = 0x5bacce;
      iVar6 = bcmp(puVar1,(void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,sVar11);
      rVar17.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
    }
  }
  else {
    rVar17.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar17.super_class_property<bool>.value;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258._0_8_ = "solutions[0] == ToByteVector(pubkeys[0].GetID())";
  local_258.m_message.px = (element_type *)0xec6c26;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_6d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_6d0 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_208 = &local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_220,1,0,WARN,_cVar19,(size_t)&local_6d8,0x68);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_58 + 0x10));
  if (scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ != 0) {
    operator_delete((void *)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ -
                    scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_);
  }
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  CSHA256::CSHA256((CSHA256 *)local_220);
  uVar10 = redeemScript.super_CScriptBase._size - 0x1d;
  uVar14 = redeemScript.super_CScriptBase._union.indirect_contents.indirect;
  if (redeemScript.super_CScriptBase._size < 0x1d) {
    uVar10 = redeemScript.super_CScriptBase._size;
    uVar14 = &redeemScript;
  }
  this_00 = CSHA256::Write((CSHA256 *)local_220,(uchar *)uVar14,(ulong)uVar10);
  CSHA256::Finalize(this_00,(uchar *)&scriptHash);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&s.super_CScriptBase,0);
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    sVar12 = s.super_CScriptBase._size;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity(&s.super_CScriptBase,sVar12);
  uVar14 = s.super_CScriptBase._union.indirect_contents.indirect;
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    uVar14 = &s.super_CScriptBase;
    sVar12 = s.super_CScriptBase._size;
  }
  local_220 = (undefined1  [8])((ulong)local_220 & 0xffffffffffffff00);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&s.super_CScriptBase,
             (uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar14)->_union +
                      (long)(int)sVar12),local_220);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_220,(uchar *)&scriptHash,
             (uchar *)&redeemScript,(allocator_type *)&local_58);
  b_11._M_extent._M_extent_value = CONCAT71(uStack_217,local_218) - (long)local_220;
  b_11._M_ptr = (pointer)local_220;
  CScript::operator<<(&s,b_11);
  if (local_220 != (undefined1  [8])0x0) {
    operator_delete((void *)local_220,(long)local_210 - (long)local_220);
  }
  local_6e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_6e0 = "";
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x71;
  file_26.m_begin = (iterator)&local_6e8;
  msg_26.m_end = pvVar16;
  msg_26.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_6f8,
             msg_26);
  local_240.m_message.px = (element_type *)((ulong)local_240.m_message.px & 0xffffffffffffff00);
  local_240._0_8_ = &PTR__lazy_ostream_013abb30;
  local_240.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  TVar5 = Solver(&s,&solutions);
  local_288 = (TxoutType *)CONCAT44(local_288._4_4_,TVar5);
  local_268 = &local_290;
  local_290._0_4_ = 7;
  local_258.m_message.px = (element_type *)0x0;
  local_258.m_message.pn.pi_ = (sp_counted_base *)0x0;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_288;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013ae1a0;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (assertion_result *)&witness_program;
  local_58.m_message.px = (element_type *)((ulong)local_58.m_message.px & 0xffffffffffffff00);
  local_58._0_8_ = &PTR__lazy_ostream_013ae1a0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_268;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(TVar5 == WITNESS_V0_SCRIPTHASH);
  boost::test_tools::tt_detail::report_assertion
            (&local_258,(lazy_ostream *)&local_240,1,2,REQUIRE,0xec6b7f,(size_t)&anchor_bytes,0x71,
             (vector<unsigned_char,std::allocator<unsigned_char>> *)local_220,
             "TxoutType::WITNESS_V0_SCRIPTHASH",(allocator_type *)&local_58);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  local_708 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_700 = "";
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x72;
  file_27.m_begin = (iterator)&local_708;
  msg_27.m_end = pvVar16;
  msg_27.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_718,
             msg_27);
  local_288 = (TxoutType *)
              (((long)solutions.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)solutions.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_240.m_message.px = (element_type *)((ulong)local_240.m_message.px & 0xffffffffffffff00);
  local_240._0_8_ = &PTR__lazy_ostream_013abb30;
  local_240.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((long)solutions.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)solutions.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x18);
  local_290 = (undefined4 *)CONCAT44(local_290._4_4_,1);
  local_258.m_message.px = (element_type *)0x0;
  local_258.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_218 = false;
  local_58.m_message.px = (element_type *)((ulong)local_58.m_message.px & 0xffffffffffffff00);
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_288;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abb70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (assertion_result *)&witness_program;
  local_268 = &local_290;
  local_58._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_268;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_258,(lazy_ostream *)&local_240,1,2,REQUIRE,0xec6ba6,(size_t)&anchor_bytes,0x72,
             (vector<unsigned_char,std::allocator<unsigned_char>> *)local_220,"1U",
             (allocator_type *)&local_58);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  local_728 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_720 = "";
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x73;
  file_28.m_begin = (iterator)&local_728;
  msg_28.m_end = pvVar16;
  msg_28.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_738,
             msg_28);
  pvVar4 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _cVar19 = 0x5bb223;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_240,(uchar *)&scriptHash,
             (uchar *)&redeemScript,(allocator_type *)local_220);
  puVar1 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  sVar11 = (long)puVar2 - (long)puVar1;
  if (sVar11 == (long)local_240.m_message.px - local_240._0_8_) {
    if (puVar2 == puVar1) {
      rVar17.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      _cVar19 = 0x5bb260;
      iVar6 = bcmp(puVar1,(void *)local_240._0_8_,sVar11);
      rVar17.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
    }
  }
  else {
    rVar17.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar17.super_class_property<bool>.value;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258._0_8_ = "solutions[0] == ToByteVector(scriptHash)";
  local_258.m_message.px = (element_type *)0xec6e2a;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_748 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_740 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_208 = &local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_220,1,0,WARN,_cVar19,(size_t)&local_748,0x73);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_58 + 0x10));
  if ((_func_int **)local_240._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_240._0_8_,(long)local_240.m_message.pn.pi_ - local_240._0_8_);
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&s.super_CScriptBase,0);
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    sVar12 = s.super_CScriptBase._size;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity(&s.super_CScriptBase,sVar12);
  uVar14 = s.super_CScriptBase._union.indirect_contents.indirect;
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    uVar14 = &s.super_CScriptBase;
    sVar12 = s.super_CScriptBase._size;
  }
  local_220[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&s.super_CScriptBase,
             (uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar14)->_union +
                      (long)(int)sVar12),local_220);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_220,
             (uchar *)&uint256::ZERO,(uchar *)&uint256::ONE,(allocator_type *)&local_58);
  b_12._M_extent._M_extent_value = CONCAT71(uStack_217,local_218) - (long)local_220;
  b_12._M_ptr = (pointer)local_220;
  CScript::operator<<(&s,b_12);
  if (local_220 != (undefined1  [8])0x0) {
    operator_delete((void *)local_220,(long)local_210 - (long)local_220);
  }
  local_758 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_750 = "";
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x78;
  file_29.m_begin = (iterator)&local_758;
  msg_29.m_end = pvVar16;
  msg_29.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_768,
             msg_29);
  local_240.m_message.px = (element_type *)((ulong)local_240.m_message.px & 0xffffffffffffff00);
  local_240._0_8_ = &PTR__lazy_ostream_013abb30;
  local_240.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  TVar5 = Solver(&s,&solutions);
  local_288 = (TxoutType *)CONCAT44(local_288._4_4_,TVar5);
  local_290._0_4_ = 9;
  local_258.m_message.px = (element_type *)0x0;
  local_258.m_message.pn.pi_ = (sp_counted_base *)0x0;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_288;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013ae1a0;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (assertion_result *)&witness_program;
  local_268 = &local_290;
  local_58.m_message.px = (element_type *)((ulong)local_58.m_message.px & 0xffffffffffffff00);
  local_58._0_8_ = &PTR__lazy_ostream_013ae1a0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_268;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(TVar5 == WITNESS_V1_TAPROOT);
  boost::test_tools::tt_detail::report_assertion
            (&local_258,(lazy_ostream *)&local_240,1,2,REQUIRE,0xec6b7f,(size_t)&anchor_bytes,0x78,
             (vector<unsigned_char,std::allocator<unsigned_char>> *)local_220,
             "TxoutType::WITNESS_V1_TAPROOT",(allocator_type *)&local_58);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  local_778 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_770 = "";
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  local_780 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x79;
  file_30.m_begin = (iterator)&local_778;
  msg_30.m_end = pvVar16;
  msg_30.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_788,
             msg_30);
  local_288 = (TxoutType *)
              (((long)solutions.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)solutions.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_240.m_message.px = (element_type *)((ulong)local_240.m_message.px & 0xffffffffffffff00);
  local_240._0_8_ = &PTR__lazy_ostream_013abb30;
  local_240.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((long)solutions.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)solutions.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x18);
  local_290 = (undefined4 *)CONCAT44(local_290._4_4_,1);
  local_258.m_message.px = (element_type *)0x0;
  local_258.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_218 = false;
  local_58.m_message.px = (element_type *)((ulong)local_58.m_message.px & 0xffffffffffffff00);
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_288;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abb70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (assertion_result *)&witness_program;
  local_268 = &local_290;
  local_58._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_268;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_258,(lazy_ostream *)&local_240,1,2,REQUIRE,0xec6ba6,(size_t)&anchor_bytes,0x79,
             (vector<unsigned_char,std::allocator<unsigned_char>> *)local_220,"1U",
             (allocator_type *)&local_58);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  local_798 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_790 = "";
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x7a;
  file_31.m_begin = (iterator)&local_798;
  msg_31.m_end = pvVar16;
  msg_31.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_7a8,
             msg_31);
  pvVar4 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _cVar19 = 0x5bb762;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_240,
             (uchar *)&uint256::ZERO,(uchar *)&uint256::ONE,(allocator_type *)local_220);
  puVar1 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  sVar11 = (long)puVar2 - (long)puVar1;
  if (sVar11 == (long)local_240.m_message.px - local_240._0_8_) {
    if (puVar2 == puVar1) {
      rVar17.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      _cVar19 = 0x5bb7a6;
      iVar6 = bcmp(puVar1,(void *)local_240._0_8_,sVar11);
      rVar17.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
    }
  }
  else {
    rVar17.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar17.super_class_property<bool>.value;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258._0_8_ = "solutions[0] == ToByteVector(uint256::ZERO)";
  local_258.m_message.px = (element_type *)0xec6e74;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_7b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_7b0 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_208 = &local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_220,1,0,WARN,_cVar19,(size_t)&local_7b8,0x7a);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_58 + 0x10));
  if ((_func_int **)local_240._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_240._0_8_,(long)local_240.m_message.pn.pi_ - local_240._0_8_);
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&s.super_CScriptBase,0);
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    sVar12 = s.super_CScriptBase._size;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity(&s.super_CScriptBase,sVar12);
  uVar14 = s.super_CScriptBase._union.indirect_contents.indirect;
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    uVar14 = &s.super_CScriptBase;
    sVar12 = s.super_CScriptBase._size;
  }
  local_220[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x60;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&s.super_CScriptBase,
             (uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar14)->_union +
                      (long)(int)sVar12),local_220);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_220,(uchar *)&uint256::ONE
             ,(uchar *)
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/index.cpp"
             ,(allocator_type *)&local_58);
  b_13._M_extent._M_extent_value = CONCAT71(uStack_217,local_218) - (long)local_220;
  b_13._M_ptr = (pointer)local_220;
  CScript::operator<<(&s,b_13);
  if (local_220 != (undefined1  [8])0x0) {
    operator_delete((void *)local_220,(long)local_210 - (long)local_220);
  }
  local_7c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_7c0 = "";
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x7f;
  file_32.m_begin = (iterator)&local_7c8;
  msg_32.m_end = pvVar16;
  msg_32.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_7d8,
             msg_32);
  local_240.m_message.px = (element_type *)((ulong)local_240.m_message.px & 0xffffffffffffff00);
  local_240._0_8_ = &PTR__lazy_ostream_013abb30;
  local_240.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  TVar5 = Solver(&s,&solutions);
  local_288 = (TxoutType *)CONCAT44(local_288._4_4_,TVar5);
  local_290._0_4_ = 10;
  local_258.m_message.px = (element_type *)0x0;
  local_258.m_message.pn.pi_ = (sp_counted_base *)0x0;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_288;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013ae1a0;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (assertion_result *)&witness_program;
  local_268 = &local_290;
  local_58.m_message.px = (element_type *)((ulong)local_58.m_message.px & 0xffffffffffffff00);
  local_58._0_8_ = &PTR__lazy_ostream_013ae1a0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_268;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(TVar5 == WITNESS_UNKNOWN);
  boost::test_tools::tt_detail::report_assertion
            (&local_258,(lazy_ostream *)&local_240,1,2,REQUIRE,0xec6b7f,(size_t)&anchor_bytes,0x7f,
             (vector<unsigned_char,std::allocator<unsigned_char>> *)local_220,
             "TxoutType::WITNESS_UNKNOWN",(allocator_type *)&local_58);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  local_7e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_7e0 = "";
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x80;
  file_33.m_begin = (iterator)&local_7e8;
  msg_33.m_end = pvVar16;
  msg_33.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_7f8,
             msg_33);
  local_288 = (TxoutType *)
              (((long)solutions.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)solutions.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abb70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (assertion_result *)&witness_program;
  local_240.m_message.px = (element_type *)((ulong)local_240.m_message.px & 0xffffffffffffff00);
  local_240._0_8_ = &PTR__lazy_ostream_013abb30;
  local_240.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_58.m_message.px = (element_type *)((ulong)local_58.m_message.px & 0xffffffffffffff00);
  local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((long)solutions.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)solutions.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x30);
  local_228 = "";
  local_290 = (undefined4 *)CONCAT44(local_290._4_4_,2);
  local_258.m_message.px = (element_type *)0x0;
  local_258.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbb0;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_288;
  local_268 = &local_290;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_268;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_258,(lazy_ostream *)&local_240,1,2,REQUIRE,0xec6ba6,(size_t)&anchor_bytes,0x80,
             (vector<unsigned_char,std::allocator<unsigned_char>> *)local_220,"2U",
             (allocator_type *)&local_58);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  local_808 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_800 = "";
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  local_810 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x81;
  file_34.m_begin = (iterator)&local_808;
  msg_34.m_end = pvVar16;
  msg_34.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_818,
             msg_34);
  pvVar4 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(anchor_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,0x10);
  _cVar19 = 0x5bbca9;
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)&anchor_bytes;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_240,__l_06,
             (allocator_type *)&witness_program);
  puVar1 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  sVar11 = (long)puVar2 - (long)puVar1;
  if (sVar11 == (long)local_240.m_message.px - local_240._0_8_) {
    if (puVar2 == puVar1) {
      rVar17.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      _cVar19 = 0x5bbcdf;
      iVar6 = bcmp(puVar1,(void *)local_240._0_8_,sVar11);
      rVar17.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
    }
  }
  else {
    rVar17.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar17.super_class_property<bool>.value;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258._0_8_ = "solutions[0] == std::vector<unsigned char>{16}";
  local_258.m_message.px = (element_type *)0xec6ebe;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_828 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_820 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_208 = &local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_220,1,0,WARN,_cVar19,(size_t)&local_828,0x81);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_58 + 0x10));
  if ((_func_int **)local_240._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_240._0_8_,(long)local_240.m_message.pn.pi_ - local_240._0_8_);
  }
  local_838 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_830 = "";
  local_848 = &boost::unit_test::basic_cstring<char_const>::null;
  local_840 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x82;
  file_35.m_begin = (iterator)&local_838;
  msg_35.m_end = pvVar16;
  msg_35.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_848,
             msg_35);
  pvVar4 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _cVar19 = 0x5bbe0a;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_240,
             (uchar *)&uint256::ONE,
             (uchar *)
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/index.cpp"
             ,(allocator_type *)local_220);
  puVar1 = pvVar4[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = pvVar4[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar11 = (long)puVar2 - (long)puVar1;
  if (sVar11 == (long)local_240.m_message.px - local_240._0_8_) {
    if (puVar2 == puVar1) {
      rVar17.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      _cVar19 = 0x5bbe48;
      iVar6 = bcmp(puVar1,(void *)local_240._0_8_,sVar11);
      rVar17.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
    }
  }
  else {
    rVar17.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar17.super_class_property<bool>.value;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258._0_8_ = "solutions[1] == ToByteVector(uint256::ONE)";
  local_258.m_message.px = (element_type *)0xec6ee9;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_858 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_850 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_208 = &local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_220,1,0,WARN,_cVar19,(size_t)&local_858,0x82);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_58 + 0x10));
  if ((_func_int **)local_240._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_240._0_8_,(long)local_240.m_message.pn.pi_ - local_240._0_8_);
  }
  local_220._0_2_ = 0x734e;
  __l_07._M_len = 2;
  __l_07._M_array = local_220;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&anchor_bytes,__l_07,(allocator_type *)&local_58);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&s.super_CScriptBase,0);
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    sVar12 = s.super_CScriptBase._size;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity(&s.super_CScriptBase,sVar12);
  uVar14 = s.super_CScriptBase._union.indirect_contents.indirect;
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    uVar14 = &s.super_CScriptBase;
    sVar12 = s.super_CScriptBase._size;
  }
  local_220[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&s.super_CScriptBase,
             (uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar14)->_union +
                      (long)(int)sVar12),local_220);
  b_14._M_extent._M_extent_value =
       (long)anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  b_14._M_ptr = anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  CScript::operator<<(&s,b_14);
  local_868 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_860 = "";
  local_878 = &boost::unit_test::basic_cstring<char_const>::null;
  local_870 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0x88;
  file_36.m_begin = (iterator)&local_868;
  msg_36.m_end = pvVar16;
  msg_36.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_878,
             msg_36);
  local_240.m_message.px = (element_type *)((ulong)local_240.m_message.px & 0xffffffffffffff00);
  local_240._0_8_ = &PTR__lazy_ostream_013abb30;
  local_240.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  TVar5 = Solver(&s,&solutions);
  local_290 = (undefined4 *)CONCAT44(local_290._4_4_,TVar5);
  local_288 = (TxoutType *)&version;
  version = 1;
  local_258.m_message.px = (element_type *)0x0;
  local_258.m_message.pn.pi_ = (sp_counted_base *)0x0;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_268 = &local_290;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013ae1a0;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (assertion_result *)&local_268;
  local_58.m_message.px = (element_type *)((ulong)local_58.m_message.px & 0xffffffffffffff00);
  local_58._0_8_ = &PTR__lazy_ostream_013ae1a0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_288;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(TVar5 == ANCHOR);
  boost::test_tools::tt_detail::report_assertion
            (&local_258,(lazy_ostream *)&local_240,1,2,REQUIRE,0xec6b7f,(size_t)&witness_program,
             0x88,local_220,"TxoutType::ANCHOR",(allocator_type *)&local_58);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  local_890 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_888 = "";
  local_8a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_898 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar19 = 0x5bc154;
  file_37.m_end = (iterator)0x89;
  file_37.m_begin = (iterator)&local_890;
  msg_37.m_end = pvVar16;
  msg_37.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_8a0,
             msg_37);
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_240._0_8_ = "solutions.empty()";
  local_240.m_message.px = (element_type *)0xec6f0d;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_8b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_8a8 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_208 = &local_240;
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (solutions.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
       solutions.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish);
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_220,1,0,WARN,_cVar19,(size_t)&local_8b0,0x89);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_58 + 0x10));
  version = -1;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_8d0 = "";
  local_8e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = (iterator)0x8e;
  file_38.m_begin = (iterator)&local_8d8;
  msg_38.m_end = pvVar16;
  msg_38.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_8e8,
             msg_38);
  _cVar19 = 0x5bc252;
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CScript::IsPayToAnchor(&s);
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_240._0_8_ = "s.IsPayToAnchor()";
  local_240.m_message.px = (element_type *)0xec6fb4;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_8f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_8f0 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_208 = &local_240;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_220,1,0,WARN,_cVar19,(size_t)&local_8f8,0x8e);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_58 + 0x10));
  local_908 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_900 = "";
  local_918 = &boost::unit_test::basic_cstring<char_const>::null;
  local_910 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0x8f;
  file_39.m_begin = (iterator)&local_908;
  msg_39.m_end = pvVar16;
  msg_39.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_918,
             msg_39);
  _cVar19 = 0x5bc32a;
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CScript::IsWitnessProgram(&s,&version,&witness_program);
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_240._0_8_ = "s.IsWitnessProgram(version, witness_program)";
  local_240.m_message.px = (element_type *)0xec6f3a;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_928 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_920 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_208 = &local_240;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_220,1,0,WARN,_cVar19,(size_t)&local_928,0x8f);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_58 + 0x10));
  local_938 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_930 = "";
  local_948 = &boost::unit_test::basic_cstring<char_const>::null;
  local_940 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0x90;
  file_40.m_begin = (iterator)&local_938;
  msg_40.m_end = pvVar16;
  msg_40.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_948,
             msg_40);
  _cVar19 = 0x5bc3f3;
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CScript::IsPayToAnchor(version,&witness_program);
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_240._0_8_ = "CScript::IsPayToAnchor(version, witness_program)";
  local_240.m_message.px = (element_type *)0xec6f6b;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_958 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_950 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_208 = &local_240;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_220,1,0,WARN,_cVar19,(size_t)&local_958,0x90);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_58 + 0x10));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&s.super_CScriptBase,0);
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    sVar12 = s.super_CScriptBase._size;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity(&s.super_CScriptBase,sVar12);
  uVar14 = s.super_CScriptBase._union.indirect_contents.indirect;
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    uVar14 = &s.super_CScriptBase;
    sVar12 = s.super_CScriptBase._size;
  }
  local_220[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x59;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&s.super_CScriptBase,
             (uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar14)->_union +
                      (long)(int)sVar12),local_220);
  uVar14 = s.super_CScriptBase._union.indirect_contents.indirect;
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    uVar14 = &s.super_CScriptBase;
    sVar12 = s.super_CScriptBase._size;
  }
  local_220[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x93;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&s.super_CScriptBase,
             (uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar14)->_union +
                      (long)(int)sVar12),local_220);
  uVar14 = s.super_CScriptBase._union.indirect_contents.indirect;
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    uVar14 = &s.super_CScriptBase;
    sVar12 = s.super_CScriptBase._size;
  }
  local_220[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x5b;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&s.super_CScriptBase,
             (uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar14)->_union +
                      (long)(int)sVar12),local_220);
  uVar14 = s.super_CScriptBase._union.indirect_contents.indirect;
  sVar12 = s.super_CScriptBase._size - 0x1d;
  if (s.super_CScriptBase._size < 0x1d) {
    uVar14 = &s.super_CScriptBase;
    sVar12 = s.super_CScriptBase._size;
  }
  local_220[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x87;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&s.super_CScriptBase,
             (uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar14)->_union +
                      (long)(int)sVar12),local_220);
  local_968 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_960 = "";
  local_978 = &boost::unit_test::basic_cstring<char_const>::null;
  local_970 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0x95;
  file_41.m_begin = (iterator)&local_968;
  msg_41.m_end = pvVar16;
  msg_41.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_978,
             msg_41);
  local_240.m_message.px = (element_type *)((ulong)local_240.m_message.px & 0xffffffffffffff00);
  local_240._0_8_ = &PTR__lazy_ostream_013abb30;
  local_240.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_97c = Solver(&s,&solutions);
  local_288 = &local_97c;
  local_290 = &local_980;
  local_980 = 0;
  local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_97c == NONSTANDARD);
  local_258.m_message.px = (element_type *)0x0;
  local_258.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_268 = (undefined4 **)0xec6abf;
  local_260 = "";
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_013ae1a0;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (assertion_result *)&local_288;
  local_58.m_message.px = (element_type *)((ulong)local_58.m_message.px & 0xffffffffffffff00);
  local_58._0_8_ = &PTR__lazy_ostream_013ae1a0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_290;
  boost::test_tools::tt_detail::report_assertion
            (&local_258,(lazy_ostream *)&local_240,1,2,REQUIRE,0xec6b7f,(size_t)&local_268,0x95,
             local_220,"TxoutType::NONSTANDARD",&local_58);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  if (witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(witness_program.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)witness_program.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)witness_program.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)anchor_bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)anchor_bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (0x1c < redeemScript.super_CScriptBase._size) {
    free(redeemScript.super_CScriptBase._union.indirect_contents.indirect);
    redeemScript.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&solutions);
  if (0x1c < s.super_CScriptBase._size) {
    free(s.super_CScriptBase._union.indirect_contents.indirect);
    s.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  lVar7 = 0x28;
  do {
    if (*(array<unsigned_char,_32UL> **)(&keys[0].fCompressed + lVar7) !=
        (array<unsigned_char,_32UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)
                 (&keys[0].fCompressed + lVar7),
                 *(array<unsigned_char,_32UL> **)(&keys[0].fCompressed + lVar7));
    }
    *(undefined8 *)(&keys[0].fCompressed + lVar7) = 0;
    lVar7 = lVar7 + -0x10;
  } while (lVar7 != -8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(script_standard_Solver_success)
{
    CKey keys[3];
    CPubKey pubkeys[3];
    for (int i = 0; i < 3; i++) {
        keys[i].MakeNewKey(true);
        pubkeys[i] = keys[i].GetPubKey();
    }

    CScript s;
    std::vector<std::vector<unsigned char> > solutions;

    // TxoutType::PUBKEY
    s.clear();
    s << ToByteVector(pubkeys[0]) << OP_CHECKSIG;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::PUBKEY);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(pubkeys[0]));

    // TxoutType::PUBKEYHASH
    s.clear();
    s << OP_DUP << OP_HASH160 << ToByteVector(pubkeys[0].GetID()) << OP_EQUALVERIFY << OP_CHECKSIG;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::PUBKEYHASH);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(pubkeys[0].GetID()));

    // TxoutType::SCRIPTHASH
    CScript redeemScript(s); // initialize with leftover P2PKH script
    s.clear();
    s << OP_HASH160 << ToByteVector(CScriptID(redeemScript)) << OP_EQUAL;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::SCRIPTHASH);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(CScriptID(redeemScript)));

    // TxoutType::MULTISIG
    s.clear();
    s << OP_1 <<
        ToByteVector(pubkeys[0]) <<
        ToByteVector(pubkeys[1]) <<
        OP_2 << OP_CHECKMULTISIG;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::MULTISIG);
    BOOST_CHECK_EQUAL(solutions.size(), 4U);
    BOOST_CHECK(solutions[0] == std::vector<unsigned char>({1}));
    BOOST_CHECK(solutions[1] == ToByteVector(pubkeys[0]));
    BOOST_CHECK(solutions[2] == ToByteVector(pubkeys[1]));
    BOOST_CHECK(solutions[3] == std::vector<unsigned char>({2}));

    s.clear();
    s << OP_2 <<
        ToByteVector(pubkeys[0]) <<
        ToByteVector(pubkeys[1]) <<
        ToByteVector(pubkeys[2]) <<
        OP_3 << OP_CHECKMULTISIG;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::MULTISIG);
    BOOST_CHECK_EQUAL(solutions.size(), 5U);
    BOOST_CHECK(solutions[0] == std::vector<unsigned char>({2}));
    BOOST_CHECK(solutions[1] == ToByteVector(pubkeys[0]));
    BOOST_CHECK(solutions[2] == ToByteVector(pubkeys[1]));
    BOOST_CHECK(solutions[3] == ToByteVector(pubkeys[2]));
    BOOST_CHECK(solutions[4] == std::vector<unsigned char>({3}));

    // TxoutType::NULL_DATA
    s.clear();
    s << OP_RETURN <<
        std::vector<unsigned char>({0}) <<
        std::vector<unsigned char>({75}) <<
        std::vector<unsigned char>({255});
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::NULL_DATA);
    BOOST_CHECK_EQUAL(solutions.size(), 0U);

    // TxoutType::WITNESS_V0_KEYHASH
    s.clear();
    s << OP_0 << ToByteVector(pubkeys[0].GetID());
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::WITNESS_V0_KEYHASH);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(pubkeys[0].GetID()));

    // TxoutType::WITNESS_V0_SCRIPTHASH
    uint256 scriptHash;
    CSHA256().Write(redeemScript.data(), redeemScript.size())
        .Finalize(scriptHash.begin());

    s.clear();
    s << OP_0 << ToByteVector(scriptHash);
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::WITNESS_V0_SCRIPTHASH);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(scriptHash));

    // TxoutType::WITNESS_V1_TAPROOT
    s.clear();
    s << OP_1 << ToByteVector(uint256::ZERO);
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::WITNESS_V1_TAPROOT);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(uint256::ZERO));

    // TxoutType::WITNESS_UNKNOWN
    s.clear();
    s << OP_16 << ToByteVector(uint256::ONE);
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::WITNESS_UNKNOWN);
    BOOST_CHECK_EQUAL(solutions.size(), 2U);
    BOOST_CHECK(solutions[0] == std::vector<unsigned char>{16});
    BOOST_CHECK(solutions[1] == ToByteVector(uint256::ONE));

    // TxoutType::ANCHOR
    std::vector<unsigned char> anchor_bytes{0x4e, 0x73};
    s.clear();
    s << OP_1 << anchor_bytes;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::ANCHOR);
    BOOST_CHECK(solutions.empty());

    // Sanity-check IsPayToAnchor
    int version{-1};
    std::vector<unsigned char> witness_program;
    BOOST_CHECK(s.IsPayToAnchor());
    BOOST_CHECK(s.IsWitnessProgram(version, witness_program));
    BOOST_CHECK(CScript::IsPayToAnchor(version, witness_program));

    // TxoutType::NONSTANDARD
    s.clear();
    s << OP_9 << OP_ADD << OP_11 << OP_EQUAL;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::NONSTANDARD);
}